

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_pdu.cc
# Opt level: O0

bool __thiscall assembler::SessionPDU::completeHeader(SessionPDU *this)

{
  bool bVar1;
  RiceCompressionHeader RVar2;
  pointer pSVar3;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_RDI;
  ImageStructureHeader IVar4;
  RiceCompressionHeader rch;
  undefined8 in_stack_00000048;
  ImageStructureHeader ish;
  pointer in_stack_ffffffffffffff68;
  HeaderMap *in_stack_ffffffffffffff70;
  pointer *this_00;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *__new_size;
  ushort uStack_64;
  byte bStack_62;
  byte bStack_48;
  ushort uStack_46;
  uint8_t uStack_42;
  HeaderMap *in_stack_ffffffffffffffc0;
  Buffer *in_stack_ffffffffffffffc8;
  HeaderMap *in_stack_ffffffffffffffd8;
  Buffer *in_stack_ffffffffffffffe0;
  bool local_1;
  
  lrit::getHeaderMap((Buffer *)in_stack_00000048);
  std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::operator=
            (in_stack_ffffffffffffff70,
             (map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)
             in_stack_ffffffffffffff68);
  std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::~map
            ((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)0x135f17)
  ;
  bVar1 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::empty
                    ((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)
                     0x135f25);
  if (bVar1) {
    local_1 = false;
  }
  else if (*(char *)((long)&in_RDI[4].
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start + 4) == '\0') {
    IVar4 = lrit::getHeader<lrit::ImageStructureHeader>
                      (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
    uStack_42 = IVar4.compression;
    if (uStack_42 == '\x01') {
      bVar1 = lrit::hasHeader<lrit::RiceCompressionHeader>(in_stack_ffffffffffffff70);
      if (bVar1) {
        RVar2 = lrit::getHeader<lrit::RiceCompressionHeader>
                          (in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
        this_00 = &in_RDI[5].super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage;
        operator_new(0x10);
        std::unique_ptr<SZ_com_t_s,_std::default_delete<SZ_com_t_s>_>::reset
                  ((unique_ptr<SZ_com_t_s,_std::default_delete<SZ_com_t_s>_> *)this_00,
                   in_stack_ffffffffffffff68);
        uStack_64 = RVar2.flags;
        pSVar3 = std::unique_ptr<SZ_com_t_s,_std::default_delete<SZ_com_t_s>_>::operator->
                           ((unique_ptr<SZ_com_t_s,_std::default_delete<SZ_com_t_s>_> *)0x136014);
        pSVar3->options_mask = uStack_64 | 0x80;
        bStack_48 = IVar4.bitsPerPixel;
        pSVar3 = std::unique_ptr<SZ_com_t_s,_std::default_delete<SZ_com_t_s>_>::operator->
                           ((unique_ptr<SZ_com_t_s,_std::default_delete<SZ_com_t_s>_> *)0x136034);
        pSVar3->bits_per_pixel = (uint)bStack_48;
        bStack_62 = RVar2.pixelsPerBlock;
        pSVar3 = std::unique_ptr<SZ_com_t_s,_std::default_delete<SZ_com_t_s>_>::operator->
                           ((unique_ptr<SZ_com_t_s,_std::default_delete<SZ_com_t_s>_> *)0x136055);
        pSVar3->pixels_per_block = (uint)bStack_62;
        uStack_46 = IVar4.columns;
        pSVar3 = std::unique_ptr<SZ_com_t_s,_std::default_delete<SZ_com_t_s>_>::operator->
                           ((unique_ptr<SZ_com_t_s,_std::default_delete<SZ_com_t_s>_> *)0x136076);
        pSVar3->pixels_per_scanline = (uint)uStack_46;
        __new_size = in_RDI + 6;
        std::unique_ptr<SZ_com_t_s,_std::default_delete<SZ_com_t_s>_>::operator->
                  ((unique_ptr<SZ_com_t_s,_std::default_delete<SZ_com_t_s>_> *)0x13609c);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                  (in_RDI,(size_type)__new_size);
      }
      local_1 = true;
    }
    else {
      local_1 = true;
    }
  }
  else {
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool SessionPDU::completeHeader() {
  m_ = lrit::getHeaderMap(buf_);
  if (m_.empty()) {
    return false;
  }

  // File type 0 is image data
  if (ph_.fileType != 0) {
    return true;
  }

  // Check compression flag.
  // If it is anything other than "1" we ignore it.
  auto ish = lrit::getHeader<lrit::ImageStructureHeader>(buf_, m_);
  if (ish.compression != 1) {
    return true;
  }

  // Quote from 5_LRIT_Mission-data.pdf (next to Figure 6)
  //
  //   If the image data is Rice compressed, then the compression
  //   flag, CFLG in the Image Structure Record will be set to a "1".
  //   For uncompressed data, this value will be "0". If the data is
  //   Rice compressed, then a third secondary header must be decoded
  //   to obtain the Rice compression parameters. This is the NOAA
  //   specific Rice Compression Record with a header type equal to
  //   "131" as shown in Figure 6.
  //
  // Therefore, we should now check if this buffer has a Rice
  // compression header and setup the decoder if so.
  //
  if (lrit::hasHeader<lrit::RiceCompressionHeader>(m_)) {
    auto rch = lrit::getHeader<lrit::RiceCompressionHeader>(buf_, m_);
    szParam_.reset(new SZ_com_t);
    szParam_->options_mask = rch.flags | SZ_RAW_OPTION_MASK;
    szParam_->bits_per_pixel = ish.bitsPerPixel;
    szParam_->pixels_per_block = rch.pixelsPerBlock;
    szParam_->pixels_per_scanline = ish.columns;
    szTmp_.resize(szParam_->pixels_per_scanline);
  }

  return true;
}